

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O1

void mathCore::to_DNF(expression *a)

{
  expSet *this;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ostream *poVar3;
  const_iterator cVar4;
  iterator __position;
  expression *a_00;
  expression *peVar5;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  expression *child;
  _Alloc_node __an;
  expression *big_term;
  expSet tempSet;
  expression *local_78;
  _Alloc_node local_70;
  expression *local_68;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DNF CALLED WITH ",0x10);
  as_string_abi_cxx11_((string *)local_60,(mathCore *)a,a_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_60._0_8_,
                      CONCAT44(local_60._12_4_,local_60._8_4_));
  peVar5 = (expression *)0x10c63f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_);
  }
  bVar2 = is_DNF(a);
  if (bVar2) {
    recursive_idempotent((mathCore *)a,peVar5);
  }
  else {
    bVar2 = is_or(a);
    if (((!bVar2) || (bVar2 = is_dualed(a), bVar2)) || (bVar2 = is_negated(a), bVar2)) {
      bVar2 = is_and(a);
      if (!bVar2) {
        return;
      }
      bVar2 = is_dualed(a);
      if (bVar2) {
        return;
      }
      bVar2 = is_negated(a);
      if (bVar2) {
        return;
      }
      local_60._24_8_ = local_60 + 8;
      local_60._8_4_ = _S_red;
      local_60._16_8_ = 0;
      local_38 = (_Base_ptr)0x0;
      this = &a->contents;
      cVar4._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(a->contents)._M_t._M_impl.super__Rb_tree_header;
      local_40 = (_Base_ptr)local_60._24_8_;
      while ((_Rb_tree_header *)cVar4._M_node != p_Var1) {
        local_78 = *(expression **)(cVar4._M_node + 1);
        cVar4._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
             ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                 *)this,cVar4);
        to_CNF(local_78);
        pVar6 = std::
                _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                ::_M_get_insert_equal_pos
                          ((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                            *)local_60,&local_78);
        local_70._M_t =
             (_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
              *)local_60;
        std::
        _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
        ::
        _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                  ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                    *)local_60,pVar6.first,pVar6.second,&local_78,&local_70);
      }
      peVar5 = (expression *)local_60;
      mergeMultiSet(this,(expSet *)peVar5);
      recursive_combine_and(a);
      idempotent_law((mathCore *)a,peVar5);
      universal_bound(a);
      bVar2 = is_DNF(a);
      if (!bVar2) {
        cVar4._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_68 = *(expression **)(cVar4._M_node + 1);
        __position = std::
                     _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                     ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                         *)this,cVar4);
        while ((_Rb_tree_header *)__position._M_node != p_Var1) {
          local_78 = *(expression **)(__position._M_node + 1);
          __position = std::
                       _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                       ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                           *)this,__position._M_node);
          do_expansion(a,local_68,local_78);
        }
        pVar6 = std::
                _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                ::_M_get_insert_equal_pos(&this->_M_t,&local_68);
        peVar5 = (expression *)pVar6.first;
        local_70._M_t = &this->_M_t;
        std::
        _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
        ::
        _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                  ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                    *)this,(_Base_ptr)peVar5,pVar6.second,&local_68,&local_70);
        empty_expression((mathCore *)a,peVar5);
      }
    }
    else {
      local_60._24_8_ = local_60 + 8;
      local_60._8_4_ = _S_red;
      local_60._16_8_ = 0;
      local_38 = (_Base_ptr)0x0;
      cVar4._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = (_Base_ptr)local_60._24_8_;
      while ((_Rb_tree_header *)cVar4._M_node != &(a->contents)._M_t._M_impl.super__Rb_tree_header)
      {
        local_78 = *(expression **)(cVar4._M_node + 1);
        cVar4._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
             ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                 *)&a->contents,cVar4);
        to_DNF(local_78);
        pVar6 = std::
                _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                ::_M_get_insert_equal_pos
                          ((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                            *)local_60,&local_78);
        local_70._M_t =
             (_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
              *)local_60;
        std::
        _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
        ::
        _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                  ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                    *)local_60,pVar6.first,pVar6.second,&local_78,&local_70);
      }
      peVar5 = (expression *)local_60;
      mergeMultiSet(&a->contents,(expSet *)peVar5);
      combine_or(a);
      idempotent_law((mathCore *)a,peVar5);
      universal_bound(a);
    }
    std::
    _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
    ::~_Rb_tree((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                 *)local_60);
  }
  return;
}

Assistant:

void mathCore::to_DNF(expression *a) {
	
	std::cout << "DNF CALLED WITH " << as_string(a) << "\n";

	if (mathCore::is_DNF(a)) { // If we are already a DNF just return!
		// Normally you need to be a minimized one, we don't bother doing that!
		recursive_idempotent(a);
		return;
	}
	else if (mathCore::is_or(a) && !(is_dualed(a) || is_negated(a))) {
		// If we are an OR statement then fancy things can happen

		expSet tempSet;
		expression* child;
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);

			to_DNF(child);
			tempSet.insert(child);
		}
		mergeMultiSet(a->contents, tempSet);
		// Our children now are DNFED!

		// Pull our children up together
		combine_or(a);
		// The only simplifcation we do is idempotent
		mathCore::idempotent_law(a);
		mathCore::universal_bound(a);

		/*
		Need Quine�McCluskey algorithm or Similar here
		Currently its dumb!
		*/
	}
	else if (mathCore::is_and(a) && !(is_dualed(a) || is_negated(a))) {
		// If we are an and statement
		expSet tempSet;
		expression* child;
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);

			to_CNF(child);
			tempSet.insert(child);
		}
		mergeMultiSet(a->contents, tempSet);
		// Our children now are CNFED!
		// First pull them all up into ourselves
		recursive_combine_and(a);
		mathCore::idempotent_law(a);
		mathCore::universal_bound(a);

		// If we became a valid DNF return
		if (is_DNF(a)) {
			return;
		}

		// We aren't a valid DNF, so something needs to be expanded
		// Iter is definitinitly a sum
		iter = a->contents.begin();
		expression* big_term = *iter;
		iter = a->contents.erase(iter);

		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);
			do_expansion(a, big_term, child);
		}

		// Put only big term back!
		a->contents.insert(big_term);
		empty_expression(a);	// Transmuting call!
	}
}